

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_GLMClassifier_2eproto::InitDefaults(void)

{
  FunctionClosure0 func;
  FunctionClosure0 local_20;
  
  if (InitDefaults::once != 2) {
    local_20.super_Closure._vptr_Closure = (_func_int **)&PTR__FunctionClosure0_00419170;
    local_20.function_ = TableStruct::InitDefaultsImpl;
    local_20.self_deleting_ = false;
    google::protobuf::GoogleOnceInitImpl(&InitDefaults::once,&local_20.super_Closure);
    google::protobuf::internal::FunctionClosure0::~FunctionClosure0(&local_20);
  }
  return;
}

Assistant:

void GLMClassifier_DoubleArray::MergeFrom(const GLMClassifier_DoubleArray& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.GLMClassifier.DoubleArray)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  value_.MergeFrom(from.value_);
}